

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O0

void __thiscall Assimp::MD3Importer::MD3Importer(MD3Importer *this)

{
  MD3Importer *this_local;
  
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_00f40d98;
  this->configFrameID = 0;
  this->configHandleMP = true;
  std::__cxx11::string::string((string *)&this->configSkinFile);
  std::__cxx11::string::string((string *)&this->configShaderFile);
  this->configSpeedFlag = false;
  this->pcHeader = (Header *)0x0;
  this->mBuffer = (uchar *)0x0;
  this->fileSize = 0;
  std::__cxx11::string::string((string *)&this->mFile);
  std::__cxx11::string::string((string *)&this->path);
  std::__cxx11::string::string((string *)&this->filename);
  this->mScene = (aiScene *)0x0;
  this->mIOHandler = (IOSystem *)0x0;
  return;
}

Assistant:

MD3Importer::MD3Importer()
    : configFrameID  (0)
    , configHandleMP (true)
    , configSpeedFlag()
    , pcHeader()
    , mBuffer()
    , fileSize()
    , mScene()
    , mIOHandler()
{}